

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O0

double __thiscall agg::bspline::interpolation(bspline *this,double x,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint i_00;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double p;
  double r;
  double h;
  double d;
  int j;
  int i_local;
  double x_local;
  bspline *this_local;
  
  i_00 = i + 1;
  dVar7 = this->m_x[i] - this->m_x[(int)i_00];
  dVar8 = x - this->m_x[(int)i_00];
  dVar9 = this->m_x[i] - x;
  dVar10 = (dVar7 * dVar7) / 6.0;
  pdVar6 = pod_array<double>::operator[](&this->m_am,i_00);
  dVar1 = *pdVar6;
  pdVar6 = pod_array<double>::operator[](&this->m_am,i);
  dVar2 = *pdVar6;
  dVar3 = this->m_y[(int)i_00];
  pdVar6 = pod_array<double>::operator[](&this->m_am,i_00);
  dVar4 = *pdVar6;
  dVar5 = this->m_y[i];
  pdVar6 = pod_array<double>::operator[](&this->m_am,i);
  return ((dVar1 * dVar9 * dVar9 * dVar9 + dVar2 * dVar8 * dVar8 * dVar8) / 6.0) / dVar7 +
         ((-dVar4 * dVar10 + dVar3) * dVar9 + (-*pdVar6 * dVar10 + dVar5) * dVar8) / dVar7;
}

Assistant:

double bspline::interpolation(double x, int i) const
    {
        int j = i + 1;
        double d = m_x[i] - m_x[j];
        double h = x - m_x[j];
        double r = m_x[i] - x;
        double p = d * d / 6.0;
        return (m_am[j] * r * r * r + m_am[i] * h * h * h) / 6.0 / d +
               ((m_y[j] - m_am[j] * p) * r + (m_y[i] - m_am[i] * p) * h) / d;
    }